

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

void lj_debug_addloc(lua_State *L,char *msg,cTValue *frame,cTValue *nextframe)

{
  uint64_t uVar1;
  uint uVar2;
  GCfunc *fn;
  char buf [60];
  char acStack_68 [72];
  
  if ((frame != (cTValue *)0x0) &&
     (fn = (GCfunc *)(frame[-1].u64 & 0x7fffffffffff), (fn->c).ffid == '\0')) {
    uVar2 = debug_frameline(L,fn,nextframe);
    if (-1 < (int)uVar2) {
      uVar1 = (fn->c).pc.ptr64;
      lj_debug_shortname(acStack_68,*(GCstr **)(uVar1 - 0x28),*(BCLine *)(uVar1 - 0x20));
      lj_strfmt_pushf(L,"%s:%d: %s",acStack_68,(ulong)uVar2,msg);
      return;
    }
  }
  lj_strfmt_pushf(L,"%s",msg);
  return;
}

Assistant:

void lj_debug_addloc(lua_State *L, const char *msg,
		     cTValue *frame, cTValue *nextframe)
{
  if (frame) {
    GCfunc *fn = frame_func(frame);
    if (isluafunc(fn)) {
      BCLine line = debug_frameline(L, fn, nextframe);
      if (line >= 0) {
	GCproto *pt = funcproto(fn);
	char buf[LUA_IDSIZE];
	lj_debug_shortname(buf, proto_chunkname(pt), pt->firstline);
	lj_strfmt_pushf(L, "%s:%d: %s", buf, line, msg);
	return;
      }
    }
  }
  lj_strfmt_pushf(L, "%s", msg);
}